

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

Shape * __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::MakeMultiple(wasm::InsertOrderedSet<CFG::
Block*>&,wasm::InsertOrderedSet<CFG::Block*>&,wasm::InsertOrderedMap<CFG::Block*,wasm::
InsertOrderedSet<CFG::Block*>>&,wasm::InsertOrderedSet<CFG::Block_>__bool_
          (void *this,BlockSet *Blocks,BlockSet *Entries,BlockBlockSetMap *IndependentGroups,
          BlockSet *NextEntries,bool IsCheckedMultiple)

{
  size_t sVar1;
  bool bVar2;
  reference __in;
  type *val;
  type *this_00;
  pointer ppVar3;
  Shape *pSVar4;
  mapped_type *ppSVar5;
  reference ppBVar6;
  Block *local_138;
  Block *Entry;
  iterator __end2_1;
  iterator __begin2_1;
  BlockSet *__range2_1;
  _List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_> local_110;
  iterator Next;
  Block *CurrTarget;
  _Self local_f8;
  iterator iter;
  Block *CurrInner;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  type *CurrBlocks;
  type *CurrEntry;
  _Self local_a8;
  iterator __end2;
  iterator __begin2;
  BlockBlockSetMap *__range2;
  BlockSet CurrEntries;
  MultipleShape *Multiple;
  bool IsCheckedMultiple_local;
  BlockSet *NextEntries_local;
  BlockBlockSetMap *IndependentGroups_local;
  BlockSet *Entries_local;
  BlockSet *Blocks_local;
  Analyzer *this_local;
  
  CurrEntries.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  _M_size = (size_t)AddMultipleShape(*this);
  ::wasm::InsertOrderedSet<CFG::Block_*>::InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)&__range2);
  __end2 = ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::begin
                     (IndependentGroups);
  local_a8._M_node =
       (_List_node_base *)
       ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::end
                 (IndependentGroups);
  while( true ) {
    bVar2 = std::operator!=(&__end2,&local_a8);
    if (!bVar2) break;
    __in = std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>
           ::operator*(&__end2);
    val = std::get<0ul,CFG::Block*const,wasm::InsertOrderedSet<CFG::Block*>>(__in);
    this_00 = std::get<1ul,CFG::Block*const,wasm::InsertOrderedSet<CFG::Block*>>(__in);
    ::wasm::InsertOrderedSet<CFG::Block_*>::clear((InsertOrderedSet<CFG::Block_*> *)&__range2);
    ::wasm::InsertOrderedSet<CFG::Block_*>::insert((InsertOrderedSet<CFG::Block_*> *)&__range2,val);
    __end3 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin(this_00);
    CurrInner = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(this_00);
    while( true ) {
      bVar2 = std::operator!=(&__end3,(_Self *)&CurrInner);
      if (!bVar2) break;
      ppBVar6 = std::_List_iterator<CFG::Block_*>::operator*(&__end3);
      iter._M_node = (_List_node_base *)*ppBVar6;
      ::wasm::InsertOrderedSet<CFG::Block_*>::erase(Blocks,(Block **)&iter);
      local_f8._M_node =
           (_List_node_base *)
           ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin
                     ((InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *)&(iter._M_node)->_M_prev);
      while( true ) {
        CurrTarget = (Block *)::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end
                                        ((InsertOrderedMap<CFG::Block_*,_CFG::Branch_*> *)
                                         &(iter._M_node)->_M_prev);
        bVar2 = std::operator!=(&local_f8,(_Self *)&CurrTarget);
        if (!bVar2) break;
        ppVar3 = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator->
                           (&local_f8);
        Next._M_node = (_List_node_base *)ppVar3->first;
        local_110._M_node = local_f8._M_node;
        std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&local_110,0);
        bVar2 = contains<wasm::InsertOrderedSet<CFG::Block*>,CFG::Block*>(this_00,(Block **)&Next);
        if (!bVar2) {
          ::wasm::InsertOrderedSet<CFG::Block_*>::insert(NextEntries,(Block **)&Next);
          Solipsize(CFG::Block*,CFG::Branch::FlowType,CFG::Shape*,wasm::InsertOrderedSet<CFG::
          Block_>__(this,(Block *)Next._M_node,Break,
                    (Shape *)CurrEntries.List.
                             super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                             _M_node._M_size,this_00);
        }
        local_f8._M_node = local_110._M_node;
      }
      std::_List_iterator<CFG::Block_*>::operator++(&__end3);
    }
    pSVar4 = Process(wasm::InsertOrderedSet<CFG::Block*>&,wasm::InsertOrderedSet<CFG::Block_>__
                       (this,this_00,(BlockSet *)&__range2);
    ppSVar5 = std::
              map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
              ::operator[]((map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
                            *)(CurrEntries.List.
                               super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl
                               ._M_node._M_size + 0x28),&(*val)->Id);
    *ppSVar5 = pSVar4;
    if (IsCheckedMultiple) {
      (*val)->IsCheckedMultipleEntry = true;
    }
    std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>::
    operator++(&__end2);
  }
  __end2_1 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin(Entries);
  Entry = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(Entries);
  while( true ) {
    bVar2 = std::operator!=(&__end2_1,(_Self *)&Entry);
    sVar1 = CurrEntries.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
            _M_node._M_size;
    if (!bVar2) break;
    ppBVar6 = std::_List_iterator<CFG::Block_*>::operator*(&__end2_1);
    local_138 = *ppBVar6;
    bVar2 = contains<wasm::InsertOrderedMap<CFG::Block*,wasm::InsertOrderedSet<CFG::Block*>>,CFG::Block*>
                      (IndependentGroups,&local_138);
    if (!bVar2) {
      ::wasm::InsertOrderedSet<CFG::Block_*>::insert(NextEntries,&local_138);
    }
    std::_List_iterator<CFG::Block_*>::operator++(&__end2_1);
  }
  ::wasm::InsertOrderedSet<CFG::Block_*>::~InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)&__range2);
  return (Shape *)sVar1;
}

Assistant:

Shape* MakeMultiple(BlockSet& Blocks,
                        BlockSet& Entries,
                        BlockBlockSetMap& IndependentGroups,
                        BlockSet& NextEntries,
                        bool IsCheckedMultiple) {
      PrintDebug("creating multiple block with %d inner groups\n",
                 IndependentGroups.size());
      MultipleShape* Multiple = Parent->AddMultipleShape();
      BlockSet CurrEntries;
      for (auto& [CurrEntry, CurrBlocks] : IndependentGroups) {
        PrintDebug("  multiple group with entry %d:\n", CurrEntry->Id);
        DebugDump(CurrBlocks, "    ");
        // Create inner block
        CurrEntries.clear();
        CurrEntries.insert(CurrEntry);
        for (auto* CurrInner : CurrBlocks) {
          // Remove the block from the remaining blocks
          Blocks.erase(CurrInner);
          // Find new next entries and fix branches to them
          for (auto iter = CurrInner->BranchesOut.begin();
               iter != CurrInner->BranchesOut.end();) {
            Block* CurrTarget = iter->first;
            auto Next = iter;
            Next++;
            if (!contains(CurrBlocks, CurrTarget)) {
              NextEntries.insert(CurrTarget);
              Solipsize(CurrTarget, Branch::Break, Multiple, CurrBlocks);
            }
            iter = Next; // increment carefully because Solipsize can remove us
          }
        }
        Multiple->InnerMap[CurrEntry->Id] = Process(CurrBlocks, CurrEntries);
        if (IsCheckedMultiple) {
          CurrEntry->IsCheckedMultipleEntry = true;
        }
      }
      DebugDump(Blocks, "  remaining blocks after multiple:");
      // Add entries not handled as next entries, they are deferred
      for (auto* Entry : Entries) {
        if (!contains(IndependentGroups, Entry)) {
          NextEntries.insert(Entry);
        }
      }
      return Multiple;
    }